

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O3

void LatencyDumpDefaultImpl::dumpRecursive(stringstream *ss,DumpItem *dump_item,size_t max_name_len)

{
  ostream *poVar1;
  LatencyItem *this;
  bool in_R9B;
  _List_node_base *p_Var2;
  string local_48;
  
  this = dump_item->itself;
  if (this != (LatencyItem *)0x0) {
    poVar1 = (ostream *)(ss + 0x10);
    if (dump_item->parent == (LatencyItem *)0x0) {
      dumpItem_abi_cxx11_(&local_48,(LatencyDumpDefaultImpl *)this,(LatencyItem *)max_name_len,0,1,
                          in_R9B);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    }
    else {
      dumpItem_abi_cxx11_(&local_48,(LatencyDumpDefaultImpl *)this,(LatencyItem *)max_name_len,
                          (dump_item->parent->hist).sum.super___atomic_base<unsigned_long>._M_i,1,
                          in_R9B);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)(ss + 0x10) + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  for (p_Var2 = (dump_item->child).
                super__List_base<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&dump_item->child; p_Var2 = p_Var2->_M_next) {
    dumpRecursive(ss,(DumpItem *)p_Var2[1]._M_next,max_name_len);
  }
  return;
}

Assistant:

static void dumpRecursive(std::stringstream& ss,
                              DumpItem* dump_item,
                              size_t max_name_len) {
        if (dump_item->itself) {
            if (dump_item->parent) {
                ss << dumpItem(dump_item->itself, max_name_len,
                               dump_item->parent->getTotalTime());
            } else {
                ss << dumpItem(dump_item->itself, max_name_len);
            }
            ss << std::endl;
        }
        for (auto& entry : dump_item->child) {
            DumpItem* child = entry.get();
            dumpRecursive(ss, child, max_name_len);
        }
    }